

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void set_time_915(uchar *p,time_t t)

{
  uchar *in_RDI;
  tm_conflict tm;
  uchar value;
  undefined4 in_stack_ffffffffffffffb8;
  uchar value_00;
  undefined4 in_stack_ffffffffffffffbc;
  uchar value_01;
  undefined4 in_stack_ffffffffffffffc0;
  uchar value_02;
  undefined4 in_stack_ffffffffffffffc4;
  char local_38;
  uchar local_34;
  long local_20;
  
  get_tmfromtime((tm_conflict *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (time_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  value = (uchar)in_stack_ffffffffffffffb8;
  value_00 = (uchar)in_stack_ffffffffffffffbc;
  value_01 = (uchar)in_stack_ffffffffffffffc0;
  value_02 = (uchar)in_stack_ffffffffffffffc4;
  set_num_711(in_RDI,local_34);
  set_num_711(in_RDI + 1,local_38 + '\x01');
  set_num_711(in_RDI + 2,value_02);
  set_num_711(in_RDI + 3,value_01);
  set_num_711(in_RDI + 4,value_00);
  set_num_711(in_RDI + 5,value);
  set_num_712(in_RDI + 6,(char)(local_20 / 900));
  return;
}

Assistant:

static void
set_time_915(unsigned char *p, time_t t)
{
	struct tm tm;

	get_tmfromtime(&tm, &t);
	set_num_711(p+0, tm.tm_year);
	set_num_711(p+1, tm.tm_mon+1);
	set_num_711(p+2, tm.tm_mday);
	set_num_711(p+3, tm.tm_hour);
	set_num_711(p+4, tm.tm_min);
	set_num_711(p+5, tm.tm_sec);
	set_num_712(p+6, (char)(get_gmoffset(&tm)/(60*15)));
}